

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O3

int Cgt_SimulationFilter(Cgt_Man_t *p,Aig_Obj_t *pCandPart,Aig_Obj_t *pMiterPart)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = ((p->nPatts >> 5) + 1) - (uint)((p->nPatts & 0x1fU) == 0);
  iVar1 = *(int *)(((ulong)pCandPart & 0xfffffffffffffffe) + 0x24);
  if (-1 < (long)iVar1) {
    uVar2 = p->vPatts->nSize;
    if (iVar1 < (int)uVar2) {
      uVar3 = pMiterPart->Id;
      if ((-1 < (long)(int)uVar3) && (uVar3 < uVar2)) {
        ppvVar4 = p->vPatts->pArray;
        pvVar5 = ppvVar4[iVar1];
        pvVar6 = ppvVar4[(int)uVar3];
        if (((ulong)pCandPart & 1) == 0) {
          if ((int)uVar8 < 1) {
            return 1;
          }
          uVar7 = 0;
          while ((*(uint *)((long)pvVar5 + uVar7 * 4) & *(uint *)((long)pvVar6 + uVar7 * 4)) == 0) {
            uVar7 = uVar7 + 1;
            if (uVar8 == uVar7) {
              return 1;
            }
          }
        }
        else {
          if ((int)uVar8 < 1) {
            return 1;
          }
          uVar7 = 0;
          while ((*(uint *)((long)pvVar6 + uVar7 * 4) & ~*(uint *)((long)pvVar5 + uVar7 * 4)) == 0)
          {
            uVar7 = uVar7 + 1;
            if (uVar8 == uVar7) {
              return 1;
            }
          }
        }
        return 0;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Cgt_SimulationFilter( Cgt_Man_t * p, Aig_Obj_t * pCandPart, Aig_Obj_t * pMiterPart )
{
    unsigned * pInfoCand, * pInfoMiter;
    int w, nWords = Abc_BitWordNum( p->nPatts );  
    pInfoCand  = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(Aig_Regular(pCandPart)) );
    pInfoMiter = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(pMiterPart) );
    // C => !M -- true   is the same as    C & M -- false
    if ( !Aig_IsComplement(pCandPart) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    return 1;
}